

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.hh
# Opt level: O0

uint __thiscall gss::innards::SVOBitset::find_first(SVOBitset *this)

{
  bool bVar1;
  _If_is_unsigned_integer<unsigned_long_long,_int> _Var2;
  SVOBitset *in_RDI;
  uint i;
  BitWord *b;
  SVOBitset *local_30;
  uint local_1c;
  
  bVar1 = _is_long(in_RDI);
  local_30 = in_RDI;
  if (bVar1) {
    local_30 = (SVOBitset *)(in_RDI->_data).short_data[0];
  }
  local_1c = 0;
  while( true ) {
    if (in_RDI->n_words <= local_1c) {
      return 0xffffffff;
    }
    if ((local_30->_data).short_data[local_1c] != 0) break;
    local_1c = local_1c + 1;
  }
  _Var2 = std::countr_zero<unsigned_long_long>(0x1ab89a);
  return local_1c * 0x40 + _Var2;
}

Assistant:

auto find_first() const -> unsigned
        {
            const BitWord * b = (_is_long() ? _data.long_data : _data.short_data);
            for (unsigned i = 0; i < n_words; ++i) {
                if (0 != b[i]) // test the input to countr_zero because on some systems, the output is undefined at b[i]=0
                    return i * bits_per_word + countr_zero(b[i]);
            }
            return npos;
        }